

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionBody::GetInlineeCodeGenRuntimeDataForTargetInlinee
          (FunctionBody *this,ProfileId profiledCallSiteId,FunctionBody *inlineeFuncBody)

{
  FunctionCodeGenRuntimeData *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar4;
  FunctionBody *pFVar5;
  Type *pTVar6;
  
  if (this->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1a3a,"(profiledCallSiteId < profiledCallSiteCount)",
                                "profiledCallSiteId < profiledCallSiteCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pWVar4 = FunctionProxy::
           GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)11,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                     ((FunctionProxy *)this);
  if (pWVar4 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    pTVar6 = pWVar4 + profiledCallSiteId;
    while (this_00 = pTVar6->ptr, this_00 != (FunctionCodeGenRuntimeData *)0x0) {
      pFVar5 = FunctionCodeGenRuntimeData::GetFunctionBody(this_00);
      if (pFVar5 == inlineeFuncBody) {
        return this_00;
      }
      pTVar6 = &this_00->next;
    }
  }
  return (FunctionCodeGenRuntimeData *)0x0;
}

Assistant:

const FunctionCodeGenRuntimeData *FunctionBody::GetInlineeCodeGenRuntimeDataForTargetInlinee(const ProfileId profiledCallSiteId, Js::FunctionBody *inlineeFuncBody) const
    {
        Assert(profiledCallSiteId < profiledCallSiteCount);

        auto codeGenRuntimeData = this->GetCodeGenRuntimeDataWithLock();
        if (!codeGenRuntimeData)
        {
            return nullptr;
        }
        const FunctionCodeGenRuntimeData *runtimeData = codeGenRuntimeData[profiledCallSiteId];
        while (runtimeData && runtimeData->GetFunctionBody() != inlineeFuncBody)
        {
            runtimeData = runtimeData->GetNext();
        }
        return runtimeData;
    }